

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Counter.cxx
# Opt level: O3

void __thiscall Fl_Counter::Fl_Counter(Fl_Counter *this,int X,int Y,int W,int H,char *L)

{
  Fl_Valuator::Fl_Valuator(&this->super_Fl_Valuator,X,Y,W,H,L);
  (this->super_Fl_Valuator).super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Counter_002770e8;
  (this->super_Fl_Valuator).super_Fl_Widget.box_ = '\x02';
  (this->super_Fl_Valuator).super_Fl_Widget.color2_ = 8;
  (this->super_Fl_Valuator).super_Fl_Widget.label_.align_ = 2;
  (this->super_Fl_Valuator).min = -1000000.0;
  (this->super_Fl_Valuator).max = 1000000.0;
  (this->super_Fl_Valuator).A = 1.0;
  *(undefined8 *)&(this->super_Fl_Valuator).B = 10;
  this->lstep_ = 1.0;
  this->mouseobj = '\0';
  this->textsize_ = FL_NORMAL_SIZE;
  this->textcolor_ = 0;
  return;
}

Assistant:

Fl_Counter::Fl_Counter(int X, int Y, int W, int H, const char* L)
  : Fl_Valuator(X, Y, W, H, L) {
  box(FL_UP_BOX);
  selection_color(FL_INACTIVE_COLOR); // was FL_BLUE
  align(FL_ALIGN_BOTTOM);
  bounds(-1000000.0, 1000000.0);
  Fl_Valuator::step(1, 10);
  lstep_ = 1.0;
  mouseobj = 0;
  textfont_ = FL_HELVETICA;
  textsize_ = FL_NORMAL_SIZE;
  textcolor_ = FL_FOREGROUND_COLOR;
}